

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

int nk_contextual_begin(nk_context *ctx,nk_flags flags,nk_vec2 size,nk_rect trigger_bounds)

{
  nk_window *pnVar1;
  nk_window *pnVar2;
  nk_rect body_00;
  int iVar3;
  bool bVar4;
  int ret;
  int is_open;
  int is_active;
  int is_clicked;
  nk_rect body;
  nk_window *popup;
  nk_window *win;
  nk_flags flags_local;
  nk_context *ctx_local;
  nk_rect trigger_bounds_local;
  nk_vec2 size_local;
  
  if (ctx == (nk_context *)0x0) {
    __assert_fail("ctx",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/drobilla[P]glfw/deps/nuklear.h"
                  ,0x5180,
                  "int nk_contextual_begin(struct nk_context *, nk_flags, struct nk_vec2, struct nk_rect)"
                 );
  }
  if (ctx->current != (nk_window *)0x0) {
    if (ctx->current->layout != (nk_panel *)0x0) {
      if (((ctx == (nk_context *)0x0) || (ctx->current == (nk_window *)0x0)) ||
         (ctx->current->layout == (nk_panel *)0x0)) {
        size_local.x = 0.0;
      }
      else {
        pnVar1 = ctx->current;
        (pnVar1->popup).con_count = (pnVar1->popup).con_count + 1;
        pnVar2 = (pnVar1->popup).win;
        bVar4 = false;
        if (pnVar2 != (nk_window *)0x0) {
          bVar4 = (pnVar1->popup).type == NK_PANEL_CONTEXTUAL;
        }
        iVar3 = nk_input_mouse_clicked(&ctx->input,NK_BUTTON_RIGHT,trigger_bounds);
        if (((pnVar1->popup).active_con == 0) ||
           ((pnVar1->popup).con_count == (pnVar1->popup).active_con)) {
          if (((iVar3 != 0) && (bVar4)) || ((!bVar4 && (iVar3 == 0)))) {
            size_local.x = 0.0;
          }
          else {
            (pnVar1->popup).active_con = (pnVar1->popup).con_count;
            if (iVar3 == 0) {
              is_active = (int)(pnVar2->bounds).x;
              is_clicked = (int)(pnVar2->bounds).y;
            }
            else {
              is_active = (int)(ctx->input).mouse.pos.x;
              is_clicked = (int)(ctx->input).mouse.pos.y;
            }
            trigger_bounds_local.w = size.x;
            trigger_bounds_local.h = size.y;
            body_00.y = (float)is_clicked;
            body_00.x = (float)is_active;
            body_00.w = trigger_bounds_local.w;
            body_00.h = trigger_bounds_local.h;
            size_local.x = (float)nk_nonblock_begin(ctx,flags | 0x20,body_00,
                                                    (nk_rect)ZEXT816((ulong)0),NK_PANEL_CONTEXTUAL);
            if (size_local.x == 0.0) {
              (pnVar1->popup).active_con = 0;
              if ((pnVar1->popup).win != (nk_window *)0x0) {
                ((pnVar1->popup).win)->flags = 0;
              }
            }
            else {
              (pnVar1->popup).type = NK_PANEL_CONTEXTUAL;
            }
          }
        }
        else {
          size_local.x = 0.0;
        }
      }
      return (int)size_local.x;
    }
    __assert_fail("ctx->current->layout",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/drobilla[P]glfw/deps/nuklear.h"
                  ,0x5182,
                  "int nk_contextual_begin(struct nk_context *, nk_flags, struct nk_vec2, struct nk_rect)"
                 );
  }
  __assert_fail("ctx->current",
                "/workspace/llm4binary/github/license_all_cmakelists_25/drobilla[P]glfw/deps/nuklear.h"
                ,0x5181,
                "int nk_contextual_begin(struct nk_context *, nk_flags, struct nk_vec2, struct nk_rect)"
               );
}

Assistant:

NK_API int
nk_contextual_begin(struct nk_context *ctx, nk_flags flags, struct nk_vec2 size,
    struct nk_rect trigger_bounds)
{
    struct nk_window *win;
    struct nk_window *popup;
    struct nk_rect body;

    NK_STORAGE const struct nk_rect null_rect = {0,0,0,0};
    int is_clicked = 0;
    int is_active = 0;
    int is_open = 0;
    int ret = 0;

    NK_ASSERT(ctx);
    NK_ASSERT(ctx->current);
    NK_ASSERT(ctx->current->layout);
    if (!ctx || !ctx->current || !ctx->current->layout)
        return 0;

    win = ctx->current;
    ++win->popup.con_count;

    /* check if currently active contextual is active */
    popup = win->popup.win;
    is_open = (popup && win->popup.type == NK_PANEL_CONTEXTUAL);
    is_clicked = nk_input_mouse_clicked(&ctx->input, NK_BUTTON_RIGHT, trigger_bounds);
    if (win->popup.active_con && win->popup.con_count != win->popup.active_con)
        return 0;
    if ((is_clicked && is_open && !is_active) || (!is_open && !is_active && !is_clicked))
        return 0;

    /* calculate contextual position on click */
    win->popup.active_con = win->popup.con_count;
    if (is_clicked) {
        body.x = ctx->input.mouse.pos.x;
        body.y = ctx->input.mouse.pos.y;
    } else {
        body.x = popup->bounds.x;
        body.y = popup->bounds.y;
    }
    body.w = size.x;
    body.h = size.y;

    /* start nonblocking contextual popup */
    ret = nk_nonblock_begin(ctx, flags|NK_WINDOW_NO_SCROLLBAR, body,
            null_rect, NK_PANEL_CONTEXTUAL);
    if (ret) win->popup.type = NK_PANEL_CONTEXTUAL;
    else {
        win->popup.active_con = 0;
        if (win->popup.win)
            win->popup.win->flags = 0;
    }
    return ret;
}